

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

Hash __thiscall
Fossilize::StateRecorder::Impl::record_shader_module
          (Impl *this,WorkItem *record_item,bool dependent_record)

{
  DatabaseInterface *pDVar1;
  bool bVar2;
  uint uVar3;
  mapped_type *pmVar4;
  uchar *puVar5;
  size_type sVar6;
  size_type sVar7;
  mapped_type *ppVVar8;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar9;
  VkShaderModule_T *pVVar10;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier;
  VkShaderModuleCreateInfo *create_info_copy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *blob;
  VkShaderModule_T *vk_object;
  Hash hash;
  VkShaderModuleCreateInfo *create_info;
  WorkItem *pWStack_20;
  bool dependent_record_local;
  WorkItem *record_item_local;
  Impl *this_local;
  
  hash = (Hash)record_item->create_info;
  vk_object = (VkShaderModule_T *)record_item->custom_hash;
  create_info._7_1_ = dependent_record;
  pWStack_20 = record_item;
  record_item_local = (WorkItem *)this;
  blob = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         api_object_cast<VkShaderModule_T*,unsigned_long>(record_item->handle);
  if ((vk_object != (VkShaderModule_T *)0x0) ||
     ((hash != 0 &&
      (bVar2 = Hashing::compute_hash_shader_module
                         ((VkShaderModuleCreateInfo *)hash,(Hash *)&vk_object), bVar2)))) {
    if (vk_object != (VkShaderModule_T *)0x0) {
      register_on_use(this,RESOURCE_SHADER_MODULE,(Hash)vk_object);
    }
    pVVar10 = vk_object;
    if (pWStack_20->handle != 0) {
      pmVar4 = std::
               unordered_map<VkShaderModule_T_*,_unsigned_long,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>_>
               ::operator[](&this->shader_module_to_hash,(key_type *)&blob);
      *pmVar4 = (mapped_type)pVVar10;
    }
    create_info_copy = (VkShaderModuleCreateInfo *)&(this->record_data).blob;
    if (this->database_iface == (DatabaseInterface *)0x0) {
      sVar7 = std::
              unordered_map<unsigned_long,_VkShaderModuleCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>_>
              ::count(&this->shader_modules,(key_type *)&vk_object);
      if (sVar7 == 0) {
        identifier = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
        bVar2 = copy_shader_module(this,(VkShaderModuleCreateInfo *)hash,&this->allocator,false,
                                   (VkShaderModuleCreateInfo **)&identifier);
        pVVar9 = identifier;
        if (bVar2) {
          ppVVar8 = std::
                    unordered_map<unsigned_long,_VkShaderModuleCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>_>
                    ::operator[](&this->shader_modules,(key_type *)&vk_object);
          *ppVVar8 = (mapped_type)pVVar9;
        }
      }
    }
    else {
      if (((this->record_data).write_database_entries & 1U) != 0) {
        bVar2 = register_application_link_hash
                          (this,RESOURCE_SHADER_MODULE,(Hash)vk_object,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)create_info_copy
                          );
        if (bVar2) {
          (this->record_data).need_flush = true;
        }
        uVar3 = (*this->database_iface->_vptr_DatabaseInterface[5])
                          (this->database_iface,4,vk_object);
        if (((uVar3 & 1) == 0) &&
           (bVar2 = serialize_shader_module
                              (this,(Hash)vk_object,(VkShaderModuleCreateInfo *)hash,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               create_info_copy,&this->allocator), pVVar10 = vk_object, bVar2)) {
          pDVar1 = this->database_iface;
          puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              create_info_copy);
          sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             create_info_copy);
          (*pDVar1->_vptr_DatabaseInterface[4])
                    (pDVar1,4,pVVar10,puVar5,sVar6,(ulong)(this->record_data).payload_flags);
          (this->record_data).need_flush = true;
        }
      }
      if ((create_info._7_1_ & 1) == 0) {
        ScratchAllocator::reset(&this->allocator);
      }
    }
    if (((this->module_identifier_database_iface != (DatabaseInterface *)0x0) &&
        ((create_info._7_1_ & 1) == 0)) &&
       (pVVar9 = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>
                           (VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT
                            ,*(void **)(hash + 8)),
       pVVar9 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0)) {
      pVVar10 = api_object_cast<VkShaderModule_T*,unsigned_long>((unsigned_long)vk_object);
      register_module_identifier(this,pVVar10,pVVar9);
    }
    this_local = (Impl *)vk_object;
  }
  else {
    std::
    unordered_map<VkShaderModule_T_*,_unsigned_long,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>_>
    ::erase(&this->shader_module_to_hash,(key_type *)&blob);
    this_local = (Impl *)vk_object;
  }
  return (Hash)this_local;
}

Assistant:

Hash StateRecorder::Impl::record_shader_module(const WorkItem &record_item, bool dependent_record)
{
	auto *create_info = reinterpret_cast<VkShaderModuleCreateInfo *>(record_item.create_info);
	Hash hash = record_item.custom_hash;
	auto vk_object = api_object_cast<VkShaderModule>(record_item.handle);

	if (hash == 0)
	{
		if (!create_info || !Hashing::compute_hash_shader_module(*create_info, &hash))
		{
			shader_module_to_hash.erase(vk_object);
			return hash;
		}
	}

	if (hash)
		register_on_use(RESOURCE_SHADER_MODULE, hash);

	if (record_item.handle != 0)
		shader_module_to_hash[vk_object] = hash;

	auto &blob = record_data.blob;

	if (database_iface)
	{
		if (record_data.write_database_entries)
		{
			if (register_application_link_hash(RESOURCE_SHADER_MODULE, hash, blob))
				record_data.need_flush = true;

			if (!database_iface->has_entry(RESOURCE_SHADER_MODULE, hash))
			{
				if (serialize_shader_module(hash, *create_info, blob, allocator))
				{
					database_iface->write_entry(RESOURCE_SHADER_MODULE, hash, blob.data(), blob.size(),
												record_data.payload_flags);
					record_data.need_flush = true;
				}
			}
		}

		// If this is called as part of a graphics pipeline library call, we must be very careful not
		// to reclaim the scratch allocator memory (yet). Otherwise we risk corruption.
		if (!dependent_record)
			allocator.reset();
	}
	else
	{
		// Retain for combined serialize() later.
		if (!shader_modules.count(hash))
		{
			VkShaderModuleCreateInfo *create_info_copy = nullptr;
			if (copy_shader_module(create_info, allocator, false, &create_info_copy))
				shader_modules[hash] = create_info_copy;
		}
	}

	// If we're a dependent record, the pipeline remapping logic will ensure to register the module.
	if (module_identifier_database_iface && !dependent_record)
	{
		auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, create_info->pNext);
		if (identifier)
			register_module_identifier(api_object_cast<VkShaderModule>(hash), *identifier);
	}

	return hash;
}